

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
XThreadEventImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:553:35),_unsigned_int>
::~XThreadEventImpl(XThreadEventImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:553:35),_unsigned_int>
                    *this)

{
  XThreadEvent::ensureDoneOrCanceled(&this->super_XThreadEvent);
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  XThreadEvent::~XThreadEvent(&this->super_XThreadEvent);
  return;
}

Assistant:

~XThreadEventImpl() noexcept(false) { ensureDoneOrCanceled(); }